

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from,CopyFn copy_fn)

{
  Arena *pAVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Rep *pRVar5;
  RepeatedPtrFieldBase *pRVar6;
  void *pvVar7;
  long unaff_RBP;
  int extend_amount;
  RepeatedPtrFieldBase *unaff_R13;
  CopyFn unaff_R14;
  void **unaff_R15;
  int local_4c;
  
  if (from == this) {
    MergeFromConcreteMessage();
  }
  else {
    iVar4 = this->current_size_;
    local_4c = from->current_size_ + iVar4;
    iVar2 = this->capacity_proxy_ + 1;
    extend_amount = local_4c - iVar2;
    if (extend_amount == 0 || local_4c < iVar2) {
      pRVar6 = this;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar5 = rep(this);
        pRVar6 = (RepeatedPtrFieldBase *)pRVar5->elements;
        iVar4 = this->current_size_;
      }
      unaff_R15 = &pRVar6->tagged_rep_or_elem_ + iVar4;
    }
    else {
      unaff_R15 = InternalExtend(this,extend_amount);
    }
    pRVar6 = from;
    if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = rep(from);
      pRVar6 = (RepeatedPtrFieldBase *)pRVar5->elements;
    }
    unaff_RBP = (long)from->current_size_;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar5 = rep(this);
      uVar3 = pRVar5->allocated_size;
    }
    unaff_R13 = pRVar6;
    unaff_R14 = copy_fn;
    if ((int)uVar3 <= this->current_size_) goto LAB_0046ec42;
  }
  iVar4 = MergeIntoClearedMessages(this,from);
  unaff_R15 = unaff_R15 + iVar4;
  pRVar6 = (RepeatedPtrFieldBase *)(&unaff_R13->tagged_rep_or_elem_ + iVar4);
  copy_fn = unaff_R14;
LAB_0046ec42:
  pAVar1 = this->arena_;
  if (0 < from->current_size_) {
    for (; pRVar6 < &((RepeatedPtrFieldBase *)(&unaff_R13->tagged_rep_or_elem_ + unaff_RBP))[-1].
                     arena_; pRVar6 = (RepeatedPtrFieldBase *)&pRVar6->current_size_) {
      pvVar7 = (*copy_fn)(pAVar1,pRVar6->tagged_rep_or_elem_);
      *unaff_R15 = pvVar7;
      unaff_R15 = unaff_R15 + 1;
    }
  }
  for (; pRVar6 < (RepeatedPtrFieldBase *)(&unaff_R13->tagged_rep_or_elem_ + unaff_RBP);
      pRVar6 = (RepeatedPtrFieldBase *)&pRVar6->current_size_) {
    pvVar7 = (*copy_fn)(pAVar1,pRVar6->tagged_rep_or_elem_);
    *unaff_R15 = pvVar7;
    unaff_R15 = unaff_R15 + 1;
  }
  this->current_size_ = local_4c;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar5 = rep(this);
    uVar3 = pRVar5->allocated_size;
  }
  if ((int)uVar3 < local_4c) {
    pRVar5 = rep(this);
    pRVar5->allocated_size = local_4c;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromConcreteMessage(
    const RepeatedPtrFieldBase& from, CopyFn copy_fn) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  void** dst = InternalReserve(new_size);
  const void* const* src = from.elements();
  auto end = src + from.current_size_;
  constexpr ptrdiff_t kPrefetchstride = 1;
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  if (from.current_size_ >= kPrefetchstride) {
    auto prefetch_end = end - kPrefetchstride;
    for (; src < prefetch_end; ++src, ++dst) {
      auto next = src + kPrefetchstride;
      absl::PrefetchToLocalCache(*next);
      *dst = copy_fn(arena, *src);
    }
  }
  for (; src < end; ++src, ++dst) {
    *dst = copy_fn(arena, *src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}